

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> __thiscall
duckdb::PhysicalHashJoin::GetLocalSourceState
          (PhysicalHashJoin *this,ExecutionContext *context,GlobalSourceState *gstate)

{
  _func_int **in_RAX;
  HashJoinGlobalSinkState *args_1;
  Allocator *args_2;
  _func_int **local_28;
  
  local_28 = in_RAX;
  args_1 = (HashJoinGlobalSinkState *)
           unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                       *)(context + 3));
  args_2 = BufferAllocator::Get((ClientContext *)gstate->_vptr_GlobalSourceState);
  make_uniq<duckdb::HashJoinLocalSourceState,duckdb::PhysicalHashJoin_const&,duckdb::HashJoinGlobalSinkState&,duckdb::Allocator&>
            ((duckdb *)&local_28,(PhysicalHashJoin *)context,args_1,args_2);
  (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
  super_PhysicalOperator._vptr_PhysicalOperator = local_28;
  return (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)this;
}

Assistant:

unique_ptr<LocalSourceState> PhysicalHashJoin::GetLocalSourceState(ExecutionContext &context,
                                                                   GlobalSourceState &gstate) const {
	return make_uniq<HashJoinLocalSourceState>(*this, sink_state->Cast<HashJoinGlobalSinkState>(),
	                                           BufferAllocator::Get(context.client));
}